

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void float_to_s16(void *ptr,long nsamp,float volume)

{
  long lVar1;
  long in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  int s;
  float mult;
  float *src;
  int16_t *dst;
  int local_30;
  float *local_28;
  float *local_20;
  long local_10;
  
  local_28 = in_RDI;
  local_20 = in_RDI;
  local_10 = in_RSI;
  while (0 < local_10) {
    lVar1 = lrintf(*local_28 * in_XMM0_Da * 32768.0);
    local_30 = (int)lVar1;
    if (local_30 < -0x8000) {
      local_30._0_2_ = 0x8000;
    }
    else {
      if (0x7fff < local_30) {
        local_30 = 0x7fff;
      }
    }
    *(undefined2 *)local_20 = (undefined2)local_30;
    local_28 = local_28 + 1;
    local_20 = (float *)((long)local_20 + 2);
    local_10 = local_10 + -1;
  }
  return;
}

Assistant:

static void
float_to_s16(void *ptr, long nsamp, float volume)
{
  int16_t *dst = ptr;
  float *src = ptr;
  float mult = volume * 32768;
  int s;

  while (nsamp-- > 0) {
    s = lrintf(*(src++) * mult);
    if (s < -32768)
      s = -32768;
    else if (s > 32767)
      s = 32767;
    *(dst++) = s;
  }
}